

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O0

char * fixup_appl(char *appl)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *applp;
  char *appl_local;
  
  pcVar2 = strrchr(appl,0x5c);
  applp = appl;
  if (pcVar2 != (char *)0x0) {
    applp = pcVar2 + 1;
  }
  pcVar2 = strrchr(applp,0x2f);
  if (pcVar2 != (char *)0x0) {
    applp = pcVar2 + 1;
  }
  sVar3 = strlen(applp);
  pcVar2 = applp + (sVar3 - 4);
  iVar1 = strcmp(pcVar2,".exe");
  if ((iVar1 != 0) && (iVar1 = strcmp(pcVar2,".EXE"), iVar1 != 0)) {
    return applp;
  }
  *pcVar2 = '\0';
  return applp;
}

Assistant:

const char *fixup_appl(char *appl)
{
    char *applp;

    /* strip pathprefix from appl */
    applp = strrchr(appl, '\\');
    if (applp != NULL)
    {
        appl = applp + 1;
    }
    applp = strrchr(appl, '/');
    if (applp != NULL)
    {
        appl = applp + 1;
    }
    /* strip possible exe suffix */
    applp = appl + strlen(appl) - 4;
    if(strcmp(applp, ".exe") == 0 || strcmp(applp, ".EXE") == 0)
    {
        *applp = '\0';
    }
    return appl;
}